

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestnewOrderSingleSetString::TestnewOrderSingleSetString
          (TestnewOrderSingleSetString *this)

{
  char *suiteName;
  TestnewOrderSingleSetString *this_local;
  
  suiteName = SuiteMessageTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"newOrderSingleSetString",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/MessagesTestCase.cpp"
             ,0x31a);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestnewOrderSingleSetString_00459070;
  return;
}

Assistant:

TEST(newOrderSingleSetString)
{
  NewOrderSingle object;

  object.setString
   ( "8=FIX.4.2\0019=48\00135=D\00111=ORDERID\00121=3\00140=2\001"
     "54=1\00155=MSFT\00160=TODAY\00110=028\001" );

  ClOrdID clOrdID;
  HandlInst handlInst;
  Symbol symbol;
  Side side;
  TransactTime transactTime;
  OrdType ordType;
  CHECK_EQUAL( "ORDERID", object.get( clOrdID ) );
  CHECK_EQUAL( '3', object.get( handlInst ) );
  CHECK_EQUAL( "MSFT", object.get( symbol ) );
  CHECK_EQUAL( '1', object.get( side ) );
  //CHECK_EQUAL( 0, object.get(transactTime) );
  CHECK_EQUAL( '2', object.get( ordType ) );
}